

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

bool exists(v_array<unsigned_long> db)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (long)db._end - (long)db._begin >> 3;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar2 == uVar3) break;
    uVar1 = uVar3 + 1;
  } while (db._begin[uVar3] == 0);
  return uVar3 < uVar2;
}

Assistant:

bool exists(v_array<size_t> db)
{
  for (size_t i = 0; i < db.size(); i++)
    if (db[i] != 0)
      return true;
  return false;
}